

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O0

Aig_Man_t * Aig_ManCreateMiter(Aig_Man_t *p1,Aig_Man_t *p2,int Oper)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *p;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  void *pvVar5;
  Aig_Obj_t *pAVar6;
  int local_34;
  Aig_Obj_t *pAStack_30;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  int Oper_local;
  Aig_Man_t *p2_local;
  Aig_Man_t *p1_local;
  
  iVar1 = Aig_ManRegNum(p1);
  if (iVar1 != 0) {
    __assert_fail("Aig_ManRegNum(p1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDup.c"
                  ,0x41e,"Aig_Man_t *Aig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
  }
  iVar1 = Aig_ManRegNum(p2);
  if (iVar1 != 0) {
    __assert_fail("Aig_ManRegNum(p2) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDup.c"
                  ,0x41f,"Aig_Man_t *Aig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
  }
  iVar1 = Aig_ManCoNum(p1);
  if (iVar1 != 1) {
    __assert_fail("Aig_ManCoNum(p1) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDup.c"
                  ,0x420,"Aig_Man_t *Aig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
  }
  iVar1 = Aig_ManCoNum(p2);
  if (iVar1 != 1) {
    __assert_fail("Aig_ManCoNum(p2) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDup.c"
                  ,0x421,"Aig_Man_t *Aig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
  }
  iVar1 = Aig_ManCiNum(p1);
  iVar2 = Aig_ManCiNum(p2);
  if (iVar1 != iVar2) {
    __assert_fail("Aig_ManCiNum(p1) == Aig_ManCiNum(p2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDup.c"
                  ,0x422,"Aig_Man_t *Aig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
  }
  iVar1 = Aig_ManObjNumMax(p1);
  iVar2 = Aig_ManObjNumMax(p2);
  p = Aig_ManStart(iVar1 + iVar2);
  pAVar3 = Aig_ManConst1(p);
  pAVar4 = Aig_ManConst1(p1);
  (pAVar4->field_5).pData = pAVar3;
  for (local_34 = 0; iVar1 = Vec_PtrSize(p1->vCis), local_34 < iVar1; local_34 = local_34 + 1) {
    pvVar5 = Vec_PtrEntry(p1->vCis,local_34);
    pAVar3 = Aig_ObjCreateCi(p);
    *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar3;
  }
  for (local_34 = 0; iVar1 = Vec_PtrSize(p1->vObjs), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p1->vObjs,local_34);
    if ((pAVar3 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar3), iVar1 != 0)) {
      pAVar4 = Aig_ObjChild0Copy(pAVar3);
      pAVar6 = Aig_ObjChild1Copy(pAVar3);
      pAVar4 = Aig_And(p,pAVar4,pAVar6);
      (pAVar3->field_5).pData = pAVar4;
    }
  }
  pAVar3 = Aig_ManConst1(p);
  pAVar4 = Aig_ManConst1(p2);
  (pAVar4->field_5).pData = pAVar3;
  for (local_34 = 0; iVar1 = Vec_PtrSize(p2->vCis), local_34 < iVar1; local_34 = local_34 + 1) {
    pvVar5 = Vec_PtrEntry(p2->vCis,local_34);
    pAVar3 = Aig_ManCi(p,local_34);
    *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar3;
  }
  for (local_34 = 0; iVar1 = Vec_PtrSize(p2->vObjs), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p2->vObjs,local_34);
    if ((pAVar3 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar3), iVar1 != 0)) {
      pAVar4 = Aig_ObjChild0Copy(pAVar3);
      pAVar6 = Aig_ObjChild1Copy(pAVar3);
      pAVar4 = Aig_And(p,pAVar4,pAVar6);
      (pAVar3->field_5).pData = pAVar4;
    }
  }
  if (Oper == 0) {
    pAVar3 = Aig_ManCo(p1,0);
    pAVar3 = Aig_ObjChild0Copy(pAVar3);
    pAVar4 = Aig_ManCo(p2,0);
    pAVar4 = Aig_ObjChild0Copy(pAVar4);
    pAStack_30 = Aig_Exor(p,pAVar3,pAVar4);
  }
  else if (Oper == 1) {
    pAVar3 = Aig_ManCo(p1,0);
    pAVar3 = Aig_ObjChild0Copy(pAVar3);
    pAVar4 = Aig_ManCo(p2,0);
    pAVar4 = Aig_ObjChild0Copy(pAVar4);
    pAVar4 = Aig_Not(pAVar4);
    pAStack_30 = Aig_And(p,pAVar3,pAVar4);
  }
  else if (Oper == 2) {
    pAVar3 = Aig_ManCo(p1,0);
    pAVar3 = Aig_ObjChild0Copy(pAVar3);
    pAVar4 = Aig_ManCo(p2,0);
    pAVar4 = Aig_ObjChild0Copy(pAVar4);
    pAStack_30 = Aig_Or(p,pAVar3,pAVar4);
  }
  else {
    if (Oper != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDup.c"
                    ,0x43a,"Aig_Man_t *Aig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
    }
    pAVar3 = Aig_ManCo(p1,0);
    pAVar3 = Aig_ObjChild0Copy(pAVar3);
    pAVar4 = Aig_ManCo(p2,0);
    pAVar4 = Aig_ObjChild0Copy(pAVar4);
    pAStack_30 = Aig_And(p,pAVar3,pAVar4);
  }
  Aig_ObjCreateCo(p,pAStack_30);
  Aig_ManCleanup(p);
  return p;
}

Assistant:

Aig_Man_t * Aig_ManCreateMiter( Aig_Man_t * p1, Aig_Man_t * p2, int Oper )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj = NULL;
    int i;
    assert( Aig_ManRegNum(p1) == 0 );
    assert( Aig_ManRegNum(p2) == 0 );
    assert( Aig_ManCoNum(p1) == 1 );
    assert( Aig_ManCoNum(p2) == 1 );
    assert( Aig_ManCiNum(p1) == Aig_ManCiNum(p2) );
    pNew = Aig_ManStart( Aig_ManObjNumMax(p1) + Aig_ManObjNumMax(p2) );
    // add first AIG
    Aig_ManConst1(p1)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p1, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    Aig_ManForEachNode( p1, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // add second AIG
    Aig_ManConst1(p2)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p2, pObj, i )
        pObj->pData = Aig_ManCi( pNew, i );
    Aig_ManForEachNode( p2, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // add the output
    if ( Oper == 0 ) // XOR
        pObj = Aig_Exor( pNew, Aig_ObjChild0Copy(Aig_ManCo(p1,0)), Aig_ObjChild0Copy(Aig_ManCo(p2,0)) );
    else if ( Oper == 1 ) // implication is PO(p1) -> PO(p2)  ...  complement is PO(p1) & !PO(p2) 
        pObj = Aig_And( pNew, Aig_ObjChild0Copy(Aig_ManCo(p1,0)), Aig_Not(Aig_ObjChild0Copy(Aig_ManCo(p2,0))) );
    else if ( Oper == 2 ) // OR
        pObj = Aig_Or( pNew, Aig_ObjChild0Copy(Aig_ManCo(p1,0)), Aig_ObjChild0Copy(Aig_ManCo(p2,0)) );
    else if ( Oper == 3 ) // AND
        pObj = Aig_And( pNew, Aig_ObjChild0Copy(Aig_ManCo(p1,0)), Aig_ObjChild0Copy(Aig_ManCo(p2,0)) );
    else
        assert( 0 );
    Aig_ObjCreateCo( pNew, pObj );
    Aig_ManCleanup( pNew );
    return pNew;
}